

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O0

void __thiscall ON_Linetype::Dump(ON_Linetype *this,ON_TextLog *dump)

{
  LineCapStyle LVar1;
  LineJoinStyle LVar2;
  LengthUnitSystem length_unit_system;
  uint uVar3;
  int iVar4;
  ON_LinetypeSegment *pOVar5;
  ON_wString *src;
  wchar_t *pwVar6;
  ON_SimpleArray<ON_2dPoint> *this_00;
  ON_SimpleArray<ON_2dPoint> *taper;
  wchar_t *s;
  ON_wString local_48;
  ON_wString usn;
  ON_UnitSystem us;
  ON_LinetypeSegment *seg;
  int i;
  int segmentCount;
  ON_TextLog *dump_local;
  ON_Linetype *this_local;
  
  ON_ModelComponent::Dump(&this->super_ON_ModelComponent,dump);
  uVar3 = SegmentCount(this);
  ON_TextLog::Print(dump,"Segment count = %d\n",(ulong)uVar3);
  PatternLength(this);
  ON_TextLog::Print(dump,"Pattern length = %g\n");
  ON_TextLog::Print(dump,"Pattern = (");
  for (seg._0_4_ = 0; (int)seg < (int)uVar3; seg._0_4_ = (int)seg + 1) {
    pOVar5 = ON_SimpleArray<ON_LinetypeSegment>::operator[](&this->m_private->m_segments,(int)seg);
    if ((int)seg != 0) {
      ON_TextLog::Print(dump,",");
    }
    if (pOVar5->m_seg_type == stLine) {
      ON_TextLog::Print(dump,"line");
    }
    else if (pOVar5->m_seg_type == stSpace) {
      ON_TextLog::Print(dump,"space");
    }
    else {
      ON_TextLog::Print(dump,"invalid");
    }
  }
  ON_TextLog::Print(dump,")\n");
  LVar1 = this->m_cap_style;
  if (LVar1 == Round) {
LAB_006aede2:
    ON_TextLog::Print(dump,"Cap = Round\n");
  }
  else if (LVar1 == Flat) {
    ON_TextLog::Print(dump,"Cap = Flat\n");
  }
  else {
    if (LVar1 != Square) goto LAB_006aede2;
    ON_TextLog::Print(dump,"Cap = Square\n");
  }
  LVar2 = this->m_join_style;
  if (LVar2 != Round) {
    if (LVar2 == Miter) {
      ON_TextLog::Print(dump,"Join = Miter\n");
      goto LAB_006aee55;
    }
    if (LVar2 == Bevel) {
      ON_TextLog::Print(dump,"Join = Bevel\n");
      goto LAB_006aee55;
    }
  }
  ON_TextLog::Print(dump,"Join = Round\n");
LAB_006aee55:
  Width(this);
  ON_TextLog::Print(dump,"Width = %d\n");
  length_unit_system = WidthUnits(this);
  ON_UnitSystem::ON_UnitSystem((ON_UnitSystem *)&usn,length_unit_system);
  src = ON_UnitSystem::UnitSystemName((ON_UnitSystem *)&usn);
  ON_wString::ON_wString(&local_48,src);
  pwVar6 = ON_wString::Array(&local_48);
  ON_TextLog::Print(dump,"Width Units = %ls\n",pwVar6);
  this_00 = TaperPoints(this);
  if ((this_00 != (ON_SimpleArray<ON_2dPoint> *)0x0) &&
     (iVar4 = ON_SimpleArray<ON_2dPoint>::Count(this_00), 0 < iVar4)) {
    uVar3 = ON_SimpleArray<ON_2dPoint>::Count(this_00);
    ON_TextLog::Print(dump,"Taper count = %d\n",(ulong)uVar3);
  }
  ON_wString::~ON_wString(&local_48);
  ON_UnitSystem::~ON_UnitSystem((ON_UnitSystem *)&usn);
  return;
}

Assistant:

void ON_Linetype::Dump( ON_TextLog& dump ) const
{
  ON_ModelComponent::Dump(dump);
  const int segmentCount = SegmentCount();
  dump.Print( "Segment count = %d\n", segmentCount);
  dump.Print( "Pattern length = %g\n", PatternLength());
  dump.Print( "Pattern = (" );
  for( int i = 0; i < segmentCount; i++)
  {
    const ON_LinetypeSegment& seg = m_private->m_segments[i];
    if ( i )
      dump.Print(",");
    switch( seg.m_seg_type)
    {
    case ON_LinetypeSegment::eSegType::stLine:
      dump.Print( "line");
      break;
    case ON_LinetypeSegment::eSegType::stSpace:
      dump.Print( "space");
      break;
    default:
      dump.Print( "invalid");
      break;
    }
  }
  dump.Print(")\n");

  switch (m_cap_style)
  {
  case ON::LineCapStyle::Flat:
    dump.Print("Cap = Flat\n");
    break;
  case ON::LineCapStyle::Square:
    dump.Print("Cap = Square\n");
    break;
  case ON::LineCapStyle::Round:
  default:
    dump.Print("Cap = Round\n");
    break;
  }

  switch (m_join_style)
  {
  case ON::LineJoinStyle::Bevel:
    dump.Print("Join = Bevel\n");
    break;
  case ON::LineJoinStyle::Miter:
    dump.Print("Join = Miter\n");
    break;
  case ON::LineJoinStyle::Round:
  default:
    dump.Print("Join = Round\n");
    break;
  }

  dump.Print("Width = %d\n", Width());
  ON_UnitSystem us(WidthUnits());
  ON_wString usn = us.UnitSystemName();
  const wchar_t* s = usn.Array();
  dump.Print("Width Units = %ls\n", s);
  
  const ON_SimpleArray<ON_2dPoint>* taper = TaperPoints();
  if (taper && taper->Count()>0)
  {
    dump.Print("Taper count = %d\n", taper->Count());
  }
}